

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O1

void dumb_remove_clicks(DUMB_CLICK_REMOVER *cr,sample_t_conflict *samples,int32 length,int step,
                       double halflife)

{
  uint uVar1;
  DUMB_CLICK *pDVar2;
  DUMB_CLICK *pDVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long lVar7;
  DUMB_CLICK *pDVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  double dVar13;
  
  if (cr != (DUMB_CLICK_REMOVER *)0x0) {
    dVar13 = exp2(-1.0 / halflife);
    dVar13 = floor(dVar13 * 2147483648.0);
    iVar12 = (int)dVar13;
    pDVar2 = dumb_click_mergesort(cr->click,cr->n_clicks);
    cr->click = (DUMB_CLICK *)0x0;
    cr->n_clicks = 0;
    if (pDVar2 == (DUMB_CLICK *)0x0) {
      iVar4 = 0;
    }
    else {
      lVar7 = (long)step;
      lVar5 = 0;
      pDVar8 = cr->free_clicks;
      do {
        pDVar3 = pDVar2;
        pDVar2 = pDVar3->next;
        lVar11 = pDVar3->pos * lVar7;
        uVar1 = cr->offset;
        uVar10 = (ulong)uVar1;
        iVar6 = (int)lVar11;
        iVar4 = (int)lVar5;
        if ((int)uVar1 < 0) {
          uVar1 = -uVar1;
          uVar10 = (ulong)uVar1;
          if (iVar4 < iVar6) {
            lVar5 = (long)iVar4;
            do {
              samples[lVar5] = samples[lVar5] - (int)uVar10;
              uVar9 = (long)((int)uVar10 * 2) * (long)iVar12;
              uVar10 = uVar9 >> 0x20;
              uVar1 = (uint)(uVar9 >> 0x20);
              lVar5 = lVar5 + lVar7;
            } while (lVar5 < iVar6);
          }
          uVar1 = -uVar1;
        }
        else if (iVar4 < iVar6) {
          lVar5 = (long)iVar4;
          do {
            samples[lVar5] = samples[lVar5] + (int)uVar10;
            uVar9 = (long)((int)uVar10 * 2) * (long)iVar12;
            uVar10 = uVar9 >> 0x20;
            uVar1 = (uint)(uVar9 >> 0x20);
            lVar5 = lVar5 + lVar7;
          } while (lVar5 < lVar11);
        }
        iVar4 = (int)lVar5;
        cr->offset = uVar1 - pDVar3->step;
        pDVar3->next = pDVar8;
        pDVar8 = pDVar3;
      } while (pDVar2 != (DUMB_CLICK *)0x0);
      cr->free_clicks = pDVar3;
    }
    iVar6 = length * step;
    uVar1 = cr->offset;
    uVar10 = (ulong)uVar1;
    if ((int)uVar1 < 0) {
      uVar1 = -uVar1;
      uVar10 = (ulong)uVar1;
      if (iVar4 < iVar6) {
        lVar5 = (long)iVar4;
        do {
          samples[lVar5] = samples[lVar5] - (int)uVar10;
          uVar9 = (long)((int)uVar10 * 2) * (long)iVar12;
          uVar10 = uVar9 >> 0x20;
          uVar1 = (uint)(uVar9 >> 0x20);
          lVar5 = lVar5 + step;
        } while (lVar5 < iVar6);
      }
      uVar1 = -uVar1;
    }
    else if (iVar4 < iVar6) {
      lVar5 = (long)iVar4;
      do {
        samples[lVar5] = samples[lVar5] + (int)uVar10;
        uVar9 = (long)((int)uVar10 * 2) * (long)iVar12;
        uVar10 = uVar9 >> 0x20;
        uVar1 = (uint)(uVar9 >> 0x20);
        lVar5 = lVar5 + step;
      } while (lVar5 < iVar6);
    }
    cr->offset = uVar1;
  }
  return;
}

Assistant:

void DUMBEXPORT dumb_remove_clicks(DUMB_CLICK_REMOVER *cr, sample_t *samples, int32 length, int step, double halflife)
{
	DUMB_CLICK *click;
	int32 pos = 0;
	int offset;
	int factor;

	if (!cr) return;

	factor = (int)floor(pow(0.5, 1.0/halflife) * (1U << 31));

	click = dumb_click_mergesort(cr->click, cr->n_clicks);
	cr->click = NULL;
	cr->n_clicks = 0;

	length *= step;

	while (click) {
		DUMB_CLICK *next = click->next;
		int end = click->pos * step;
		ASSERT(end <= length);
		offset = cr->offset;
		if (offset < 0) {
			offset = -offset;
			while (pos < end) {
				samples[pos] -= offset;
				offset = (int)(((LONG_LONG)(offset << 1) * factor) >> 32);
				pos += step;
			}
			offset = -offset;
		} else {
			while (pos < end) {
				samples[pos] += offset;
				offset = (int)(((LONG_LONG)(offset << 1) * factor) >> 32);
				pos += step;
			}
		}
		cr->offset = offset - click->step;
		free_click(cr, click);
		click = next;
	}

	offset = cr->offset;
	if (offset < 0) {
		offset = -offset;
		while (pos < length) {
			samples[pos] -= offset;
			offset = (int)((LONG_LONG)(offset << 1) * factor >> 32);
			pos += step;
		}
		offset = -offset;
	} else {
		while (pos < length) {
			samples[pos] += offset;
			offset = (int)((LONG_LONG)(offset << 1) * factor >> 32);
			pos += step;
		}
	}
	cr->offset = offset;
}